

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O2

shared_ptr<Pipeline> __thiscall QPDFLogger::getWarn(QPDFLogger *this,bool null_okay)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined7 in_register_00000031;
  shared_ptr<Pipeline> sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (*(long *)(*(long *)CONCAT71(in_register_00000031,null_okay) + 0x50) == 0) {
    sVar2 = getError(this,null_okay);
    _Var1 = sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)CONCAT71(in_register_00000031,null_okay) + 0x50));
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::getWarn(bool null_okay)
{
    if (m->p_warn) {
        return m->p_warn;
    }
    return getError(null_okay);
}